

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::restorecavity
          (tetgenmesh *this,arraypool *crosstets,arraypool *topnewtets,arraypool *botnewtets,
          arraypool *missingshbds)

{
  tetrahedron *pppdVar1;
  tetrahedron pt;
  int iVar2;
  bool bVar3;
  triface *t;
  tetrahedron value;
  int local_84;
  uint local_80;
  int j;
  int i;
  int t1ver;
  point *ppt;
  face checkseg;
  face *parysh;
  triface spintet;
  triface neightet;
  triface *parytet;
  arraypool *missingshbds_local;
  arraypool *botnewtets_local;
  arraypool *topnewtets_local;
  arraypool *crosstets_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&parysh);
  face::face((face *)&ppt);
  for (local_80 = 0; (long)(int)local_80 < crosstets->objects; local_80 = local_80 + 1) {
    t = (triface *)
        (crosstets->toparray[(int)local_80 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
        (int)((local_80 & crosstets->objectsperblockmark) * crosstets->objectbytes));
    t->ver = 0;
    t->ver = 0;
    while (t->ver < 4) {
      fsym(this,t,(triface *)&spintet.ver);
      bVar3 = infected(this,(triface *)&spintet.ver);
      if (!bVar3) {
        bond(this,t,(triface *)&spintet.ver);
      }
      t->ver = t->ver + 1;
    }
    t->ver = 0;
    pppdVar1 = t->tet;
    for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
      pt = pppdVar1[(long)local_84 + 4];
      value = encode(this,t);
      setpoint2tet(this,(point)pt,value);
    }
  }
  for (local_80 = 0; (long)(int)local_80 < crosstets->objects; local_80 = local_80 + 1) {
    uninfect(this,(triface *)
                  (crosstets->toparray
                   [(int)local_80 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
                  (int)((local_80 & crosstets->objectsperblockmark) * crosstets->objectbytes)));
  }
  triface::operator=(&this->recenttet,
                     (triface *)
                     crosstets->toparray[0 >> ((byte)crosstets->log2objectsperblock & 0x1f)]);
  for (local_80 = 0; (long)(int)local_80 < missingshbds->objects; local_80 = local_80 + 1) {
    checkseg._8_8_ =
         missingshbds->toparray[(int)local_80 >> ((byte)missingshbds->log2objectsperblock & 0x1f)] +
         (int)((local_80 & missingshbds->objectsperblockmark) * missingshbds->objectbytes);
    sspivot(this,(face *)checkseg._8_8_,(face *)&ppt);
    if ((ppt[3] != (point)0x0) && (bVar3 = sinfected(this,(face *)&ppt), bVar3)) {
      sstpivot1(this,(face *)&ppt,(triface *)&spintet.ver);
      triface::operator=((triface *)&parysh,(triface *)&spintet.ver);
      do {
        tssdissolve1(this,(triface *)&parysh);
        iVar2 = (int)spintet.tet;
        decode(this,(tetrahedron)(&parysh->sh)[facepivot1[(int)spintet.tet]],(triface *)&parysh);
        spintet.tet._0_4_ = facepivot2[iVar2][(int)spintet.tet];
      } while (parysh != (face *)spintet._8_8_);
      shellfacedealloc(this,this->subsegs,(shellface *)ppt);
      ssdissolve(this,(face *)checkseg._8_8_);
    }
  }
  for (local_80 = 0; (long)(int)local_80 < topnewtets->objects; local_80 = local_80 + 1) {
    tetrahedrondealloc(this,*(tetrahedron **)
                             (topnewtets->toparray
                              [(int)local_80 >> ((byte)topnewtets->log2objectsperblock & 0x1f)] +
                             (int)((local_80 & topnewtets->objectsperblockmark) *
                                  topnewtets->objectbytes)));
  }
  if (botnewtets != (arraypool *)0x0) {
    for (local_80 = 0; (long)(int)local_80 < botnewtets->objects; local_80 = local_80 + 1) {
      tetrahedrondealloc(this,*(tetrahedron **)
                               (botnewtets->toparray
                                [(int)local_80 >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                               (int)((local_80 & botnewtets->objectsperblockmark) *
                                    botnewtets->objectbytes)));
    }
  }
  arraypool::restart(crosstets);
  arraypool::restart(topnewtets);
  if (botnewtets != (arraypool *)0x0) {
    arraypool::restart(botnewtets);
  }
  return;
}

Assistant:

void tetgenmesh::restorecavity(arraypool *crosstets, arraypool *topnewtets,
                               arraypool *botnewtets, arraypool *missingshbds)
{
  triface *parytet, neightet, spintet;
  face *parysh;
  face checkseg;
  point *ppt;
  int t1ver;
  int i, j;

  // Reconnect crossing tets to cavity boundary.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    parytet->ver = 0;
    for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
      fsym(*parytet, neightet);
      if (!infected(neightet)) {
        // Restore the old connections of tets.
        bond(*parytet, neightet);
      }
    }
    // Update the point-to-tet map.
    parytet->ver = 0;
    ppt = (point *) &(parytet->tet[4]);
    for (j = 0; j < 4; j++) {
      setpoint2tet(ppt[j], encode(*parytet));
    }
  }

  // Uninfect all crossing tets.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    uninfect(*parytet);
  }

  // Remember a live handle.
  recenttet = * (triface *) fastlookup(crosstets, 0);

  // Delete faked segments.
  for (i = 0; i < missingshbds->objects; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, checkseg);
    if (checkseg.sh[3] != NULL) {
      if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
        sstpivot1(checkseg, neightet);
        spintet = neightet;
        while (1) {
          tssdissolve1(spintet);
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
        shellfacedealloc(subsegs, checkseg.sh);
        ssdissolve(*parysh);
        //checkseg.sh = NULL;
      }
    }
  } // i

  // Delete new tets.
  for (i = 0; i < topnewtets->objects; i++) {
    parytet = (triface *) fastlookup(topnewtets, i);
    tetrahedrondealloc(parytet->tet);
  }

  if (botnewtets != NULL) {
    for (i = 0; i < botnewtets->objects; i++) {
      parytet = (triface *) fastlookup(botnewtets, i);
      tetrahedrondealloc(parytet->tet);
    }
  }

  crosstets->restart();
  topnewtets->restart();
  if (botnewtets != NULL) {
    botnewtets->restart();
  }
}